

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O2

void __thiscall toml::detail::syntax::key::key(key *this,spec *s)

{
  either local_50;
  sequence local_30;
  
  (this->super_scanner_base)._vptr_scanner_base = (_func_int **)&PTR__key_004e98f0;
  dotted_key(&local_30,s);
  simple_key(&local_50,s);
  either::either<toml::detail::sequence,toml::detail::either>(&this->scanner_,&local_30,&local_50);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_50.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_30.others_);
  return;
}

Assistant:

TOML11_INLINE key::key(const spec& s) noexcept
    : scanner_(dotted_key(s), simple_key(s))
{}